

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddCompositeConstruct
          (InstructionBuilder *this,uint32_t type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  pointer puVar1;
  IRContext *this_00;
  InstructionBuilder *this_01;
  uint32_t res_id;
  Instruction *pIVar2;
  pointer puVar3;
  uint local_68;
  spv_operand_type_t local_64;
  InstructionBuilder *local_60;
  initializer_list<unsigned_int> local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_60 = this;
  for (puVar3 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_68 = *puVar3;
    local_64 = SPV_OPERAND_TYPE_ID;
    local_58._M_len = 1;
    local_58._M_array = &local_68;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&ops,
               &local_64,&local_58);
  }
  pIVar2 = (Instruction *)operator_new(0x70);
  this_01 = local_60;
  this_00 = local_60->context_;
  res_id = IRContext::TakeNextId(this_00);
  Instruction::Instruction(pIVar2,this_00,OpCompositeConstruct,type,res_id,&ops);
  local_58._M_array = (iterator)pIVar2;
  pIVar2 = AddInstruction(this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   *)&local_58);
  if ((Instruction *)local_58._M_array != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_58._M_array)->_vptr_IntrusiveNodeBase
      [1])();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
  return pIVar2;
}

Assistant:

Instruction* AddCompositeConstruct(uint32_t type,
                                     const std::vector<uint32_t>& ids) {
    std::vector<Operand> ops;
    for (auto id : ids) {
      ops.emplace_back(SPV_OPERAND_TYPE_ID,
                       std::initializer_list<uint32_t>{id});
    }
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> construct(
        new Instruction(GetContext(), spv::Op::OpCompositeConstruct, type,
                        GetContext()->TakeNextId(), ops));
    return AddInstruction(std::move(construct));
  }